

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_target.cc
# Opt level: O0

int LLVMFuzzerTestOneInput(uint8_t *data,size_t size)

{
  string_view data_00;
  size_type in_RSI;
  char *in_RDI;
  string *in_stack_00000058;
  InputFileFactory *in_stack_00000060;
  StringPieceInputFileFactory factory;
  char *data2;
  StringPieceInputFileFactory *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [32];
  basic_string_view<char,_std::char_traits<char>_> local_40 [4];
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_40,in_RDI,in_RSI);
  data_00._M_str = in_stack_fffffffffffffea0;
  data_00._M_len = in_stack_fffffffffffffe98;
  bloaty::StringPieceInputFileFactory::StringPieceInputFileFactory
            (in_stack_fffffffffffffe90,data_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bloaty::RunBloaty(in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bloaty::RunBloaty(in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bloaty::RunBloaty(in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bloaty::RunBloaty(in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bloaty::RunBloaty(in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bloaty::RunBloaty(in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec7);
  bloaty::StringPieceInputFileFactory::~StringPieceInputFileFactory
            ((StringPieceInputFileFactory *)0x16d1c4);
  return 0;
}

Assistant:

int LLVMFuzzerTestOneInput(const uint8_t *data, size_t size) {
  const char *data2 = reinterpret_cast<const char*>(data);
  bloaty::StringPieceInputFileFactory factory(string_view(data2, size));

  // Try all of the data sources.
  RunBloaty(factory, "segments");
  RunBloaty(factory, "sections");
  RunBloaty(factory, "symbols");
  RunBloaty(factory, "compileunits");
  RunBloaty(factory, "inlines");
  RunBloaty(factory, "armembers");

  return 0;
}